

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_setNumFourOpsChn(ADL_MIDIPlayer *device,int ops4)

{
  uint32_t uVar1;
  MIDIplay *play;
  OPL3 *this;
  bool bVar2;
  int iVar3;
  allocator local_149;
  string local_148;
  char errBuff [250];
  
  iVar3 = -1;
  if (device != (ADL_MIDIPlayer *)0x0) {
    play = (MIDIplay *)device->adl_midiPlayer;
    if (play == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x1b8,"int adl_setNumFourOpsChn(ADL_MIDIPlayer *, int)");
    }
    if ((int)((play->m_setup).numChips * 6) < ops4) {
      snprintf(errBuff,0xfa,
               "number of four-op channels may only be 0..%u when %u OPL3 cards are used.\n");
      std::__cxx11::string::string((string *)&local_148,errBuff,&local_149);
      MIDIplay::setErrorString(play,&local_148);
      std::__cxx11::string::_M_dispose();
    }
    else {
      this = (play->m_synth).m_p;
      (play->m_setup).numFourOps = ops4;
      bVar2 = OPL3::setupLocked(this);
      iVar3 = 0;
      if (!bVar2) {
        uVar1 = (play->m_setup).numFourOps;
        if ((int)uVar1 < 0) {
          adlCalculateFourOpChannels(play,true);
        }
        else {
          this->m_numFourOps = uVar1;
        }
        OPL3::updateChannelCategories(this);
      }
    }
  }
  return iVar3;
}

Assistant:

ADLMIDI_EXPORT int adl_setNumFourOpsChn(ADL_MIDIPlayer *device, int ops4)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    if(ops4 > 6 * static_cast<int>(play->m_setup.numChips))
    {
        char errBuff[250];
        snprintf(errBuff, 250, "number of four-op channels may only be 0..%u when %u OPL3 cards are used.\n", (6 * (play->m_setup.numChips)), play->m_setup.numChips);
        play->setErrorString(errBuff);
        return -1;
    }

    Synth &synth = *play->m_synth;
    play->m_setup.numFourOps = ops4;
    if(!synth.setupLocked())
    {
        if(play->m_setup.numFourOps < 0)
            adlCalculateFourOpChannels(play, true);
        else
            synth.m_numFourOps = static_cast<uint32_t>(play->m_setup.numFourOps);
        synth.updateChannelCategories();
    }

    return 0;
}